

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JtagTypes.h
# Opt level: O2

string * __thiscall
JtagShiftedData::GetTDOLengthString_abi_cxx11_
          (string *__return_storage_ptr__,JtagShiftedData *this,bool with_parentheses)

{
  undefined7 in_register_00000011;
  char *__format;
  S8 bit_count_buffer [128];
  allocator local_99;
  char local_98 [136];
  
  __format = "%llu";
  if ((int)CONCAT71(in_register_00000011,with_parentheses) != 0) {
    __format = "(%llu)";
  }
  sprintf(local_98,__format,
          (long)(this->mTdoBits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->mTdoBits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_98,&local_99);
  return __return_storage_ptr__;
}

Assistant:

std::string GetTDOLengthString( bool with_parentheses = true ) const
    {
        U64 bit_count = mTdoBits.size();
        S8 bit_count_buffer[ 128 ];
        if( with_parentheses )
            sprintf( bit_count_buffer, "(%llu)", bit_count );
        else
            sprintf( bit_count_buffer, "%llu", bit_count );
        std::string bit_count_string = bit_count_buffer;
        return bit_count_string;
    }